

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O0

void __thiscall
amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::AllocateBuffer
          (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *this,size_type a_capacity)

{
  BCRec *pBVar1;
  size_type in_RSI;
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_RDI;
  pointer new_data;
  allocator<amrex::BCRec> *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  new_allocator<amrex::BCRec> *this_00;
  size_type in_stack_ffffffffffffffc8;
  BCRec *src;
  new_allocator<amrex::BCRec> *in_stack_ffffffffffffffd0;
  pointer dst;
  
  pBVar1 = __gnu_cxx::new_allocator<amrex::BCRec>::allocate
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
  ;
  if (in_RDI->m_data != (pointer)0x0) {
    dst = in_RDI->m_data;
    src = pBVar1;
    size(in_RDI);
    detail::memCopyImpl<std::allocator<amrex::BCRec>>
              (dst,src,(size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    Gpu::streamSynchronize();
  }
  this_00 = (new_allocator<amrex::BCRec> *)in_RDI->m_data;
  capacity(in_RDI);
  __gnu_cxx::new_allocator<amrex::BCRec>::deallocate
            (this_00,(BCRec *)in_stack_ffffffffffffffb8,0x7e4aa5);
  in_RDI->m_data = pBVar1;
  in_RDI->m_capacity = in_RSI;
  return;
}

Assistant:

void AllocateBuffer (size_type a_capacity) noexcept
        {
            pointer new_data = allocate(a_capacity);
            if (m_data) {
                detail::memCopyImpl<Allocator>(new_data, m_data, size() * sizeof(T), *this);
                amrex::Gpu::streamSynchronize();
            }
            deallocate(m_data, capacity());
            m_data = new_data;
            m_capacity = a_capacity;
        }